

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDeferredTestReporter.cpp
# Opt level: O0

void __thiscall
UnitTest::anon_unknown_0::
TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage::
~TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage
          (TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage *this)

{
  TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage *this_local;
  
  ~TestDeferredTestReporterFixtureDeferredTestReporterTakesCopyOfFailureMessage(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST_FIXTURE(DeferredTestReporterFixture, DeferredTestReporterTakesCopyOfFailureMessage)
{
    reporter.ReportTestStart(details);

    char failureMessage[128];
    char const* goodStr = "Real failure message";
    char const* badStr = "Bogus failure message";
    
	using namespace std;

    strcpy(failureMessage, goodStr);
    reporter.ReportFailure(details, failureMessage);
    strcpy(failureMessage, badStr);

    DeferredTestResult const& result = reporter.GetResults().at(0);
    DeferredTestResult::Failure const& failure = result.failures.at(0);
    CHECK_EQUAL(goodStr, failure.second);
}